

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_checkingOwningModelBothUnits_Test::~Units_checkingOwningModelBothUnits_Test
          (Units_checkingOwningModelBothUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, checkingOwningModelBothUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0); // m^2
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001); // standard, exponent.
    u2->addUnit("dimensionless");

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}